

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::MergeSort<short>
               (short *list,uint32 length,CompareVarsInfo *cvInfo,ArenaAllocator *allocator)

{
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *p_Var1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  short *psVar6;
  ulong uVar7;
  ulong uVar8;
  short *psVar9;
  short *psVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong local_40;
  short local_34;
  short local_32 [4];
  short rightElement;
  ulong uVar14;
  
  p_Var1 = cvInfo->compareType;
  psVar6 = Memory::AllocateArray<Memory::ArenaAllocator,short,false>
                     ((Memory *)allocator,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                      (ulong)length);
  local_40 = 1;
  uVar15 = 2;
  do {
    uVar14 = uVar15;
    uVar13 = (uint)uVar14;
    if (length * 2 <= uVar13) {
      return;
    }
    uVar15 = local_40;
    for (uVar12 = 0; iVar5 = (int)uVar15, uVar12 < length; uVar12 = uVar12 + uVar13) {
      uVar11 = uVar12 + (int)local_40;
      if (uVar11 < length) {
        uVar8 = (ulong)(uVar11 - 1);
        psVar10 = list + uVar8;
        bVar4 = (*p_Var1)(cvInfo,list + uVar11,psVar10);
        if (bVar4) {
          uVar7 = (ulong)(uVar12 + uVar13);
          if (length <= uVar12 + uVar13) {
            uVar7 = (ulong)length;
          }
          uVar16 = 0xffffffff;
          psVar9 = psVar6;
          for (; uVar15 < uVar7; uVar15 = uVar15 + 1) {
            *psVar9 = list[uVar15];
            uVar16 = (ulong)((int)uVar16 + 1);
            psVar9 = psVar9 + 1;
          }
          local_32[0] = psVar6[uVar16];
          while( true ) {
            local_34 = *psVar10;
            iVar2 = (int)uVar15;
            lVar17 = 0;
            while( true ) {
              uVar15 = uVar16 + lVar17;
              bVar4 = (*p_Var1)(cvInfo,local_32,&local_34);
              iVar3 = (int)lVar17;
              uVar11 = iVar2 + -1 + iVar3;
              if (bVar4) break;
              list[uVar11] = local_32[0];
              if ((int)uVar15 == 0) {
                uVar11 = (iVar3 + iVar2) - 1;
                uVar15 = 0;
                goto LAB_00a6a444;
              }
              local_32[0] = psVar6[(uint)((int)uVar16 + -1 + iVar3)];
              lVar17 = lVar17 + -1;
            }
            list[uVar11] = local_34;
            if ((uint)uVar8 <= uVar12) break;
            uVar8 = (ulong)((uint)uVar8 - 1);
            psVar10 = list + uVar8;
            uVar16 = uVar15 & 0xffffffff;
            uVar15 = (ulong)(uint)(iVar2 + -1 + iVar3);
          }
          uVar11 = (iVar3 + iVar2) - 2;
          list[uVar11] = local_32[0];
LAB_00a6a444:
          while( true ) {
            uVar11 = uVar11 - 1;
            bVar4 = uVar15 == 0;
            uVar15 = uVar15 - 1;
            if (bVar4) break;
            list[uVar11] = psVar6[uVar15];
          }
        }
      }
      uVar15 = (ulong)(iVar5 + uVar13);
    }
    uVar15 = (ulong)(uVar13 * 2);
    local_40 = uVar14;
  } while( true );
}

Assistant:

void JavascriptArray::MergeSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo, ArenaAllocator* allocator)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        T* buffer = AnewArray(allocator, T, length);
        uint32 bucketSize = 2, lastSize = 1, position = 0, left = 0, mid = 0, right = 0, i = 0, j = 0, k = 0;
        uint32 doubleLength = length + length;
        T rightElement, leftElement;

        while (bucketSize < doubleLength)
        {
            while (position < length)
            {
                left = position;
                mid = left + lastSize;

                // perform a merge but only if it's necessary
                if (mid < length && compareType (cvInfo, &list[mid], &list[mid - 1]))
                {
                    right = position + bucketSize;
                    right = right < length ? right : length;
                    i = mid - 1, j = 0, k = mid;

                    while (k < right)
                    {
                        buffer[j++] = list[k++];
                    }
    
                    rightElement = buffer[--j];
                    leftElement = list[i];

                    for (;;)
                    {
                        if (compareType (cvInfo, &rightElement, &leftElement))
                        {
                            list[--k] = leftElement;
                            if (i > left)
                            {
                                leftElement = list[--i];
                            }
                            else
                            {
                                list[--k] = rightElement;
                                break;
                            }
                        }
                        else
                        {
                            list[--k] = rightElement;
                            if (j > 0)
                            {
                                rightElement = buffer[--j];
                            }
                            else
                            {
                                break;
                            }
                        }
                    }

                    while (j > 0)
                    {
                        list[--k] = buffer[--j];
                    }
                }  
                position += bucketSize;
            }
            position = 0;
            lastSize = bucketSize;
            bucketSize *= 2;
        }
    }